

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O1

void __thiscall
mp::ArrayRef<double>::init_from_rvalue<mp::ArrayRef<double>>
          (ArrayRef<double> *this,ArrayRef<double> *other)

{
  pointer pdVar1;
  pointer pdVar2;
  size_t sVar3;
  
  if ((other->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (other->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this->data_ = other->data_;
    sVar3 = other->size_;
  }
  else {
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->save_);
    pdVar1 = (this->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this->data_ = pdVar1;
    sVar3 = (long)pdVar2 - (long)pdVar1 >> 3;
  }
  this->size_ = sVar3;
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }